

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O1

int convert_RGB_to_YCoCg(uchar *orig,int width,int height,int channels)

{
  uint uVar1;
  int iVar2;
  uchar uVar3;
  ulong uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  
  iVar2 = -1;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0xfffffffd < channels - 5U)) {
    iVar2 = height * width;
    if (channels == 3) {
      if (0 < iVar2) {
        uVar4 = 0;
        do {
          uVar5 = orig[uVar4 + 1] + 1 >> 1;
          uVar8 = (uint)orig[uVar4] + (uint)orig[uVar4 + 2] + 2 >> 2;
          iVar7 = (int)(((uint)orig[uVar4] - (uint)orig[uVar4 + 2]) + 1) >> 1;
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          cVar6 = (char)iVar7;
          if (iVar7 < -0x7f) {
            cVar6 = -0x80;
          }
          orig[uVar4] = cVar6 + 0x80;
          uVar1 = uVar8 + uVar5;
          if (0xfe < uVar1) {
            uVar1 = 0xff;
          }
          uVar5 = (uVar5 - uVar8) + 0x80;
          if (0xfe < (int)uVar5) {
            uVar5 = 0xff;
          }
          orig[uVar4 + 1] = (uchar)uVar1;
          orig[uVar4 + 2] = (uchar)uVar5;
          uVar4 = uVar4 + 3;
        } while (uVar4 < (uint)(iVar2 * 3));
        return 0;
      }
    }
    else if (0 < iVar2) {
      uVar4 = 0;
      do {
        uVar8 = orig[uVar4 + 1] + 1 >> 1;
        uVar5 = (uint)orig[uVar4] + (uint)orig[uVar4 + 2] + 2 >> 2;
        iVar7 = (int)(((uint)orig[uVar4] - (uint)orig[uVar4 + 2]) + 1) >> 1;
        if (0x7e < iVar7) {
          iVar7 = 0x7f;
        }
        cVar6 = (char)iVar7;
        if (iVar7 < -0x7f) {
          cVar6 = -0x80;
        }
        orig[uVar4] = cVar6 + 0x80;
        iVar7 = (uVar8 - uVar5) + 0x80;
        uVar3 = (uchar)iVar7;
        if (0xfe < iVar7) {
          uVar3 = 0xff;
        }
        orig[uVar4 + 1] = uVar3;
        uVar5 = uVar5 + uVar8;
        if (0xfe < uVar5) {
          uVar5 = 0xff;
        }
        orig[uVar4 + 2] = orig[uVar4 + 3];
        orig[uVar4 + 3] = (uchar)uVar5;
        uVar4 = uVar4 + 4;
      } while (uVar4 < (uint)(iVar2 * 4));
      return 0;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
	convert_RGB_to_YCoCg
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Y	*/
			orig[i+1] = clamp_byte( g + tmp );
			/*	Cg	*/
			orig[i+2] = clamp_byte( 128 + g - tmp );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			unsigned char a = orig[i+3];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Cg	*/
			orig[i+1] = clamp_byte( 128 + g - tmp );
			/*	Alpha	*/
			orig[i+2] = a;
			/*	Y	*/
			orig[i+3] = clamp_byte( g + tmp );
		}
	}
	/*	done	*/
	return 0;
}